

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_rowcol_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  uint uVar18;
  uint uVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  short sVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  int iVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  uint uVar62;
  ulong uVar63;
  uint uVar64;
  int iVar65;
  ulong uVar66;
  int16_t iVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  __m256i vMaxH;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  short local_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short sStack_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short sStack_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  undefined1 local_160 [32];
  undefined2 local_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_100 [32];
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_rowcol_diag_avx2_256_16_cold_7();
  }
  else {
    uVar63 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_6();
    }
    else if (open < 0) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_rowcol_diag_avx2_256_16_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_rowcol_diag_avx2_256_16_cold_2();
          return (parasail_result_t *)0x0;
        }
        uVar66 = (ulong)(uint)_s1Len;
        if (_s1Len < 1) {
          parasail_sw_rowcol_diag_avx2_256_16_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar66 = (ulong)(uint)matrix->length;
      }
      iVar65 = matrix->min;
      iVar28 = -iVar65;
      if (iVar65 != -open && SBORROW4(iVar65,-open) == iVar65 + open < 0) {
        iVar28 = open;
      }
      uVar30 = iVar28 - 0x7fff;
      sVar43 = 0x7ffe - (short)matrix->max;
      iVar67 = (int16_t)uVar30;
      local_160._2_2_ = iVar67;
      local_160._0_2_ = iVar67;
      local_160._4_2_ = iVar67;
      local_160._6_2_ = iVar67;
      local_160._8_2_ = iVar67;
      local_160._10_2_ = iVar67;
      local_160._12_2_ = iVar67;
      local_160._14_2_ = iVar67;
      local_160._16_2_ = iVar67;
      local_160._18_2_ = iVar67;
      local_160._20_2_ = iVar67;
      local_160._22_2_ = iVar67;
      local_160._24_2_ = iVar67;
      local_160._26_2_ = iVar67;
      local_160._28_2_ = iVar67;
      local_160._30_2_ = iVar67;
      local_220._2_2_ = iVar67;
      local_220._0_2_ = iVar67;
      local_220._4_2_ = iVar67;
      local_220._6_2_ = iVar67;
      local_220._8_2_ = iVar67;
      local_220._10_2_ = iVar67;
      local_220._12_2_ = iVar67;
      local_220._14_2_ = iVar67;
      local_220._16_2_ = iVar67;
      local_220._18_2_ = iVar67;
      local_220._20_2_ = iVar67;
      local_220._22_2_ = iVar67;
      local_220._24_2_ = iVar67;
      local_220._26_2_ = iVar67;
      local_220._28_2_ = iVar67;
      local_220._30_2_ = iVar67;
      local_1a0._2_2_ = iVar67;
      local_1a0._0_2_ = iVar67;
      local_1a0._4_2_ = iVar67;
      local_1a0._6_2_ = iVar67;
      local_1a0._8_2_ = iVar67;
      local_1a0._10_2_ = iVar67;
      local_1a0._12_2_ = iVar67;
      local_1a0._14_2_ = iVar67;
      local_1a0._16_2_ = iVar67;
      local_1a0._18_2_ = iVar67;
      local_1a0._20_2_ = iVar67;
      local_1a0._22_2_ = iVar67;
      local_1a0._24_2_ = iVar67;
      local_1a0._26_2_ = iVar67;
      local_1a0._28_2_ = iVar67;
      local_1a0._30_2_ = iVar67;
      uVar26 = (uint)uVar66;
      ppVar21 = parasail_result_new_rowcol1(uVar26,s2Len);
      if (ppVar21 != (parasail_result_t *)0x0) {
        ppVar21->flag = ppVar21->flag | 0x10241004;
        uVar23 = (ulong)(s2Len + 0x1e);
        ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar23);
        ptr_00 = parasail_memalign_int16_t(0x20,uVar23);
        ptr_01 = parasail_memalign_int16_t(0x20,uVar23);
        if (ptr_01 != (int16_t *)0x0 &&
            (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          if (matrix->type == 0) {
            iVar65 = uVar26 + 0xf;
            ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar65);
            if (ptr_02 == (int16_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar26) {
              piVar3 = matrix->mapper;
              uVar23 = 0;
              do {
                ptr_02[uVar23] = (int16_t)piVar3[(byte)_s1[uVar23]];
                uVar23 = uVar23 + 1;
              } while (uVar66 != uVar23);
            }
            iVar28 = uVar26 + 1;
            if ((int)(uVar26 + 1) < iVar65) {
              iVar28 = iVar65;
            }
            memset(ptr_02 + (int)uVar26,0,(ulong)(~uVar26 + iVar28) * 2 + 2);
          }
          else {
            ptr_02 = (int16_t *)0x0;
          }
          uVar64 = s2Len + 0xf;
          auVar71._2_2_ = iVar67;
          auVar71._0_2_ = iVar67;
          auVar71._4_2_ = iVar67;
          auVar71._6_2_ = iVar67;
          auVar71._8_2_ = iVar67;
          auVar71._10_2_ = iVar67;
          auVar71._12_2_ = iVar67;
          auVar71._14_2_ = iVar67;
          auVar13._16_2_ = iVar67;
          auVar13._0_16_ = auVar71;
          auVar13._18_2_ = iVar67;
          auVar13._20_2_ = iVar67;
          auVar13._22_2_ = iVar67;
          auVar13._24_2_ = iVar67;
          auVar13._26_2_ = iVar67;
          auVar13._28_2_ = iVar67;
          auVar13._30_2_ = iVar67;
          auVar68 = vpslldq_avx2(ZEXT1632(auVar71),0xe);
          local_100 = vpblendw_avx2(auVar13,auVar68,0x80);
          local_80 = (undefined2)open;
          local_a0 = (undefined2)gap;
          local_120 = (undefined2)uVar66;
          local_c0 = (undefined2)s2Len;
          piVar3 = matrix->mapper;
          uVar23 = 1;
          if (1 < s2Len) {
            uVar23 = uVar63;
          }
          uVar29 = 0;
          do {
            *(short *)(ptr[1] + uVar29 * 2 + 0xe) = (short)piVar3[(byte)_s2[uVar29]];
            uVar29 = uVar29 + 1;
          } while (uVar23 != uVar29);
          *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
          *ptr = (undefined1  [16])0x0;
          uVar25 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar64) {
            uVar25 = uVar64;
          }
          uVar29 = 0;
          local_180 = sVar43;
          sStack_17e = sVar43;
          sStack_17c = sVar43;
          sStack_17a = sVar43;
          sStack_178 = sVar43;
          sStack_176 = sVar43;
          sStack_174 = sVar43;
          sStack_172 = sVar43;
          sStack_170 = sVar43;
          sStack_16e = sVar43;
          sStack_16c = sVar43;
          sStack_16a = sVar43;
          sStack_168 = sVar43;
          sStack_166 = sVar43;
          sStack_164 = sVar43;
          sStack_162 = sVar43;
          uStack_11e = local_120;
          uStack_11c = local_120;
          uStack_11a = local_120;
          uStack_118 = local_120;
          uStack_116 = local_120;
          uStack_114 = local_120;
          uStack_112 = local_120;
          uStack_110 = local_120;
          uStack_10e = local_120;
          uStack_10c = local_120;
          uStack_10a = local_120;
          uStack_108 = local_120;
          uStack_106 = local_120;
          uStack_104 = local_120;
          uStack_102 = local_120;
          uStack_be = local_c0;
          uStack_bc = local_c0;
          uStack_ba = local_c0;
          uStack_b8 = local_c0;
          uStack_b6 = local_c0;
          uStack_b4 = local_c0;
          uStack_b2 = local_c0;
          uStack_b0 = local_c0;
          uStack_ae = local_c0;
          uStack_ac = local_c0;
          uStack_aa = local_c0;
          uStack_a8 = local_c0;
          uStack_a6 = local_c0;
          uStack_a4 = local_c0;
          uStack_a2 = local_c0;
          uStack_9e = local_a0;
          uStack_9c = local_a0;
          uStack_9a = local_a0;
          uStack_98 = local_a0;
          uStack_96 = local_a0;
          uStack_94 = local_a0;
          uStack_92 = local_a0;
          uStack_90 = local_a0;
          uStack_8e = local_a0;
          uStack_8c = local_a0;
          uStack_8a = local_a0;
          uStack_88 = local_a0;
          uStack_86 = local_a0;
          uStack_84 = local_a0;
          uStack_82 = local_a0;
          uStack_7e = local_80;
          uStack_7c = local_80;
          uStack_7a = local_80;
          uStack_78 = local_80;
          uStack_76 = local_80;
          uStack_74 = local_80;
          uStack_72 = local_80;
          uStack_70 = local_80;
          uStack_6e = local_80;
          uStack_6c = local_80;
          uStack_6a = local_80;
          uStack_68 = local_80;
          uStack_66 = local_80;
          uStack_64 = local_80;
          uStack_62 = local_80;
          memset(ptr[1] + uVar63 * 2 + 0xe,0,(ulong)(~s2Len + uVar25) * 2 + 2);
          do {
            ptr_00[uVar29 + 0xf] = 0;
            ptr_01[uVar29 + 0xf] = iVar67;
            uVar29 = uVar29 + 1;
          } while (uVar23 != uVar29);
          lVar22 = 0;
          do {
            ptr_00[lVar22] = iVar67;
            ptr_01[lVar22] = iVar67;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0xf);
          lVar22 = uVar63 + 0xf;
          uVar23 = uVar63;
          do {
            ptr_00[lVar22] = iVar67;
            ptr_01[lVar22] = iVar67;
            lVar22 = lVar22 + 1;
            uVar25 = (int)uVar23 + 1;
            uVar23 = (ulong)uVar25;
          } while ((int)uVar25 < (int)uVar64);
          auVar69 = ZEXT3264(local_220);
          if ((int)uVar26 < 1) {
            local_1e0._2_2_ = iVar67;
            local_1e0._0_2_ = iVar67;
            local_1e0._4_2_ = iVar67;
            local_1e0._6_2_ = iVar67;
            local_1e0._10_2_ = iVar67;
            local_1e0._8_2_ = iVar67;
            local_1e0._12_2_ = iVar67;
            local_1e0._14_2_ = iVar67;
            local_1e0._18_2_ = iVar67;
            local_1e0._16_2_ = iVar67;
            local_1e0._20_2_ = iVar67;
            local_1e0._22_2_ = iVar67;
            local_1e0._26_2_ = iVar67;
            local_1e0._24_2_ = iVar67;
            local_1e0._28_2_ = iVar67;
            local_1e0._30_2_ = iVar67;
            local_200._2_2_ = sStack_17e;
            local_200._0_2_ = local_180;
            local_200._4_2_ = sStack_17c;
            local_200._6_2_ = sStack_17a;
            local_200._10_2_ = sStack_176;
            local_200._8_2_ = sStack_178;
            local_200._12_2_ = sStack_174;
            local_200._14_2_ = sStack_172;
            local_200._18_2_ = sStack_16e;
            local_200._16_2_ = sStack_170;
            local_200._20_2_ = sStack_16c;
            local_200._22_2_ = sStack_16a;
            local_200._26_2_ = sStack_166;
            local_200._24_2_ = sStack_168;
            local_200._28_2_ = sStack_164;
            local_200._30_2_ = sStack_162;
          }
          else {
            piVar3 = matrix->matrix;
            uVar26 = uVar26 - 1;
            uVar29 = (ulong)uVar26;
            uVar23 = 1;
            if (1 < (int)uVar64) {
              uVar23 = (ulong)uVar64;
            }
            local_1c0._8_8_ = 0x80009000a000b;
            local_1c0._0_8_ = 0xc000d000e000f;
            local_1c0._16_8_ = 0x4000500060007;
            local_1c0._24_8_ = 0x100020003;
            local_e0 = 1;
            uStack_de = 1;
            uStack_dc = 1;
            uStack_da = 1;
            uStack_d8 = 1;
            uStack_d6 = 1;
            uStack_d4 = 1;
            uStack_d2 = 1;
            uStack_d0 = 1;
            uStack_ce = 1;
            uStack_cc = 1;
            uStack_ca = 1;
            uStack_c8 = 1;
            uStack_c6 = 1;
            uStack_c4 = 1;
            uStack_c2 = 1;
            local_140 = 0x10;
            uStack_13e = 0x10;
            uStack_13c = 0x10;
            uStack_13a = 0x10;
            uStack_138 = 0x10;
            uStack_136 = 0x10;
            uStack_134 = 0x10;
            uStack_132 = 0x10;
            uStack_130 = 0x10;
            uStack_12e = 0x10;
            uStack_12c = 0x10;
            uStack_12a = 0x10;
            uStack_128 = 0x10;
            uStack_126 = 0x10;
            uStack_124 = 0x10;
            uStack_122 = 0x10;
            local_200._2_2_ = sStack_17e;
            local_200._0_2_ = local_180;
            local_200._4_2_ = sStack_17c;
            local_200._6_2_ = sStack_17a;
            local_200._10_2_ = sStack_176;
            local_200._8_2_ = sStack_178;
            local_200._12_2_ = sStack_174;
            local_200._14_2_ = sStack_172;
            local_200._18_2_ = sStack_16e;
            local_200._16_2_ = sStack_170;
            local_200._20_2_ = sStack_16c;
            local_200._22_2_ = sStack_16a;
            local_200._26_2_ = sStack_166;
            local_200._24_2_ = sStack_168;
            local_200._28_2_ = sStack_164;
            local_200._30_2_ = sStack_162;
            local_1e0._2_2_ = iVar67;
            local_1e0._0_2_ = iVar67;
            local_1e0._4_2_ = iVar67;
            local_1e0._6_2_ = iVar67;
            local_1e0._10_2_ = iVar67;
            local_1e0._8_2_ = iVar67;
            local_1e0._12_2_ = iVar67;
            local_1e0._14_2_ = iVar67;
            local_1e0._18_2_ = iVar67;
            local_1e0._16_2_ = iVar67;
            local_1e0._20_2_ = iVar67;
            local_1e0._22_2_ = iVar67;
            local_1e0._26_2_ = iVar67;
            local_1e0._24_2_ = iVar67;
            local_1e0._28_2_ = iVar67;
            local_1e0._30_2_ = iVar67;
            uVar58 = 0;
            do {
              iVar65 = matrix->type;
              uVar25 = (uint)uVar58;
              uVar64 = uVar25;
              if (iVar65 == 0) {
                uVar64 = (uint)ptr_02[uVar58];
              }
              uVar24 = uVar58 | 1;
              if (iVar65 == 0) {
                uVar31 = (int)ptr_02[uVar24];
              }
              else {
                uVar31 = uVar26;
                if (uVar24 < uVar66) {
                  uVar31 = uVar25 | 1;
                }
              }
              uVar33 = uVar58 | 2;
              if (iVar65 == 0) {
                uVar45 = (int)ptr_02[uVar33];
              }
              else {
                uVar45 = uVar26;
                if (uVar33 < uVar66) {
                  uVar45 = uVar25 | 2;
                }
              }
              uVar34 = uVar58 | 3;
              if (iVar65 == 0) {
                uVar46 = (int)ptr_02[uVar34];
              }
              else {
                uVar46 = uVar26;
                if (uVar34 < uVar66) {
                  uVar46 = uVar25 | 3;
                }
              }
              uVar35 = uVar58 | 4;
              if (iVar65 == 0) {
                uVar47 = (int)ptr_02[uVar35];
              }
              else {
                uVar47 = uVar26;
                if (uVar35 < uVar66) {
                  uVar47 = uVar25 | 4;
                }
              }
              uVar36 = uVar58 | 5;
              if (iVar65 == 0) {
                uVar48 = (int)ptr_02[uVar36];
              }
              else {
                uVar48 = uVar26;
                if (uVar36 < uVar66) {
                  uVar48 = uVar25 | 5;
                }
              }
              uVar37 = uVar58 | 6;
              if (iVar65 == 0) {
                uVar49 = (int)ptr_02[uVar37];
              }
              else {
                uVar49 = uVar26;
                if (uVar37 < uVar66) {
                  uVar49 = uVar25 | 6;
                }
              }
              iVar28 = matrix->size;
              uVar61 = uVar58 | 7;
              if (iVar65 == 0) {
                uVar32 = (int)ptr_02[uVar61];
              }
              else {
                uVar32 = uVar26;
                if (uVar61 < uVar66) {
                  uVar32 = uVar25 | 7;
                }
              }
              uVar38 = uVar58 | 8;
              if (iVar65 == 0) {
                uVar50 = (int)ptr_02[uVar38];
              }
              else {
                uVar50 = uVar26;
                if (uVar38 < uVar66) {
                  uVar50 = uVar25 | 8;
                }
              }
              uVar39 = uVar58 | 9;
              if (iVar65 == 0) {
                uVar51 = (int)ptr_02[uVar39];
              }
              else {
                uVar51 = uVar26;
                if (uVar39 < uVar66) {
                  uVar51 = uVar25 | 9;
                }
              }
              uVar40 = uVar58 | 10;
              if (iVar65 == 0) {
                uVar52 = (int)ptr_02[uVar40];
              }
              else {
                uVar52 = uVar26;
                if (uVar40 < uVar66) {
                  uVar52 = uVar25 | 10;
                }
              }
              uVar41 = uVar58 | 0xb;
              if (iVar65 == 0) {
                uVar53 = (int)ptr_02[uVar41];
              }
              else {
                uVar53 = uVar26;
                if (uVar41 < uVar66) {
                  uVar53 = uVar25 | 0xb;
                }
              }
              uVar42 = uVar58 | 0xc;
              if (iVar65 == 0) {
                uVar54 = (int)ptr_02[uVar42];
              }
              else {
                uVar54 = uVar26;
                if (uVar42 < uVar66) {
                  uVar54 = uVar25 | 0xc;
                }
              }
              uVar56 = uVar58 | 0xd;
              if (iVar65 == 0) {
                uVar62 = (int)ptr_02[uVar56];
              }
              else {
                uVar62 = uVar26;
                if (uVar56 < uVar66) {
                  uVar62 = uVar25 | 0xd;
                }
              }
              uVar57 = uVar58 | 0xe;
              if (iVar65 == 0) {
                uVar18 = (int)ptr_02[uVar57];
              }
              else {
                uVar18 = uVar26;
                if (uVar57 < uVar66) {
                  uVar18 = uVar25 | 0xe;
                }
              }
              uVar59 = uVar58 | 0xf;
              if (iVar65 == 0) {
                uVar19 = (int)ptr_02[uVar59];
              }
              else {
                uVar19 = uVar26;
                if (uVar59 < uVar66) {
                  uVar19 = uVar25 | 0xf;
                }
              }
              auVar68._2_2_ = uStack_11e;
              auVar68._0_2_ = local_120;
              auVar68._4_2_ = uStack_11c;
              auVar68._6_2_ = uStack_11a;
              auVar68._8_2_ = uStack_118;
              auVar68._10_2_ = uStack_116;
              auVar68._12_2_ = uStack_114;
              auVar68._14_2_ = uStack_112;
              auVar68._16_2_ = uStack_110;
              auVar68._18_2_ = uStack_10e;
              auVar68._20_2_ = uStack_10c;
              auVar68._22_2_ = uStack_10a;
              auVar68._24_2_ = uStack_108;
              auVar68._26_2_ = uStack_106;
              auVar68._28_2_ = uStack_104;
              auVar68._30_2_ = uStack_102;
              auVar10 = vpcmpgtw_avx2(auVar68,local_1c0);
              auVar13 = vpmovsxbw_avx2(_DAT_008d4a94);
              auVar9._2_2_ = iVar67;
              auVar9._0_2_ = iVar67;
              auVar9._4_2_ = iVar67;
              auVar9._6_2_ = iVar67;
              auVar9._8_2_ = iVar67;
              auVar9._10_2_ = iVar67;
              auVar9._12_2_ = iVar67;
              auVar9._14_2_ = iVar67;
              auVar9._16_2_ = iVar67;
              auVar9._18_2_ = iVar67;
              auVar9._20_2_ = iVar67;
              auVar9._22_2_ = iVar67;
              auVar9._24_2_ = iVar67;
              auVar9._26_2_ = iVar67;
              auVar9._28_2_ = iVar67;
              auVar9._30_2_ = iVar67;
              uVar60 = 0;
              auVar14 = auVar9;
              auVar68 = local_100;
              auVar8 = local_100;
              do {
                auVar71 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar32 * iVar28) +
                                                           (long)*(short *)(ptr[1] + uVar60 * 2)]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar49 * iVar28) +
                                                       (long)*(short *)(ptr[1] + uVar60 * 2 + 2)),1)
                ;
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar48 * iVar28) +
                                                               (long)*(short *)(ptr[1] + uVar60 * 2
                                                                                         + 4)),2);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar47 * iVar28) +
                                                               (long)*(short *)(ptr[1] + uVar60 * 2
                                                                                         + 6)),3);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar46 * iVar28) +
                                                               (long)*(short *)(ptr[1] + uVar60 * 2
                                                                                         + 8)),4);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar45 * iVar28) +
                                                               (long)*(short *)(ptr[1] + uVar60 * 2
                                                                                         + 10)),5);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar31 * iVar28) +
                                                               (long)*(short *)(ptr[1] + uVar60 * 2
                                                                                         + 0xc)),6);
                auVar71 = vpinsrw_avx(auVar71,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar64 * iVar28) +
                                                               (long)*(short *)(ptr[1] + uVar60 * 2
                                                                                         + 0xe)),7);
                auVar72 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar19 * iVar28) +
                                                           (long)*(short *)(*ptr + uVar60 * 2)]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar18 * iVar28) +
                                                       (long)*(short *)(*ptr + uVar60 * 2 + 2)),1);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar62 * iVar28) +
                                                               (long)*(short *)(*ptr + uVar60 * 2 +
                                                                                       4)),2);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar54 * iVar28) +
                                                               (long)*(short *)(*ptr + uVar60 * 2 +
                                                                                       6)),3);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar53 * iVar28) +
                                                               (long)*(short *)(*ptr + uVar60 * 2 +
                                                                                       8)),4);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar52 * iVar28) +
                                                               (long)*(short *)(*ptr + uVar60 * 2 +
                                                                                       10)),5);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar51 * iVar28) +
                                                               (long)*(short *)(*ptr + uVar60 * 2 +
                                                                                       0xc)),6);
                auVar72 = vpinsrw_avx(auVar72,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar50 * iVar28) +
                                                               (long)*(short *)(*ptr + uVar60 * 2 +
                                                                                       0xe)),7);
                auVar74._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar72;
                auVar74._16_16_ = ZEXT116(1) * auVar71;
                auVar74 = vpaddsw_avx2(auVar8,auVar74);
                iVar1 = ptr_00[uVar60 + 0xf];
                auVar73._2_2_ = iVar1;
                auVar73._0_2_ = iVar1;
                auVar73._4_2_ = iVar1;
                auVar73._6_2_ = iVar1;
                auVar73._8_2_ = iVar1;
                auVar73._10_2_ = iVar1;
                auVar73._12_2_ = iVar1;
                auVar73._14_2_ = iVar1;
                auVar73._16_2_ = iVar1;
                auVar73._18_2_ = iVar1;
                auVar73._20_2_ = iVar1;
                auVar73._22_2_ = iVar1;
                auVar73._24_2_ = iVar1;
                auVar73._26_2_ = iVar1;
                auVar73._28_2_ = iVar1;
                auVar73._30_2_ = iVar1;
                auVar8 = vpalignr_avx2(ZEXT1632(auVar68._16_16_),auVar68,2);
                auVar73 = vpblendw_avx2(auVar8,auVar73,0x80);
                auVar8 = vpblendd_avx2(auVar8,auVar73,0xf0);
                auVar9 = vpalignr_avx2(ZEXT1632(auVar9._16_16_),auVar9,2);
                iVar1 = ptr_01[uVar60 + 0xf];
                auVar75._2_2_ = iVar1;
                auVar75._0_2_ = iVar1;
                auVar75._4_2_ = iVar1;
                auVar75._6_2_ = iVar1;
                auVar75._8_2_ = iVar1;
                auVar75._10_2_ = iVar1;
                auVar75._12_2_ = iVar1;
                auVar75._14_2_ = iVar1;
                auVar75._16_2_ = iVar1;
                auVar75._18_2_ = iVar1;
                auVar75._20_2_ = iVar1;
                auVar75._22_2_ = iVar1;
                auVar75._24_2_ = iVar1;
                auVar75._26_2_ = iVar1;
                auVar75._28_2_ = iVar1;
                auVar75._30_2_ = iVar1;
                auVar73 = vpblendw_avx2(auVar9,auVar75,0x80);
                auVar73 = vpblendd_avx2(auVar9,auVar73,0xf0);
                auVar70._2_2_ = uStack_7e;
                auVar70._0_2_ = local_80;
                auVar70._4_2_ = uStack_7c;
                auVar70._6_2_ = uStack_7a;
                auVar70._8_2_ = uStack_78;
                auVar70._10_2_ = uStack_76;
                auVar70._12_2_ = uStack_74;
                auVar70._14_2_ = uStack_72;
                auVar70._16_2_ = uStack_70;
                auVar70._18_2_ = uStack_6e;
                auVar70._20_2_ = uStack_6c;
                auVar70._22_2_ = uStack_6a;
                auVar70._24_2_ = uStack_68;
                auVar70._26_2_ = uStack_66;
                auVar70._28_2_ = uStack_64;
                auVar70._30_2_ = uStack_62;
                auVar9 = vpsubsw_avx2(auVar8,auVar70);
                auVar11._2_2_ = uStack_9e;
                auVar11._0_2_ = local_a0;
                auVar11._4_2_ = uStack_9c;
                auVar11._6_2_ = uStack_9a;
                auVar11._8_2_ = uStack_98;
                auVar11._10_2_ = uStack_96;
                auVar11._12_2_ = uStack_94;
                auVar11._14_2_ = uStack_92;
                auVar11._16_2_ = uStack_90;
                auVar11._18_2_ = uStack_8e;
                auVar11._20_2_ = uStack_8c;
                auVar11._22_2_ = uStack_8a;
                auVar11._24_2_ = uStack_88;
                auVar11._26_2_ = uStack_86;
                auVar11._28_2_ = uStack_84;
                auVar11._30_2_ = uStack_82;
                auVar73 = vpsubsw_avx2(auVar73,auVar11);
                auVar9 = vpmaxsw_avx2(auVar9,auVar73);
                auVar68 = vpsubsw_avx2(auVar68,auVar70);
                auVar14 = vpsubsw_avx2(auVar14,auVar11);
                auVar73 = vpmaxsw_avx2(auVar68,auVar14);
                auVar68 = vpmaxsw_avx2(auVar73,auVar9);
                auVar68 = vpmaxsw_avx2(auVar68,_DAT_008d4700);
                auVar74 = vpmaxsw_avx2(auVar74,auVar68);
                auVar14 = vpcmpeqw_avx2(auVar13,_DAT_008d4ac0);
                auVar68 = vpandn_avx2(auVar14,auVar74);
                if (0xf < uVar60) {
                  local_200 = vpminsw_avx2(auVar68,local_200);
                  local_1e0 = vpmaxsw_avx2(auVar68,local_1e0);
                }
                piVar4 = ((ppVar21->field_4).rowcols)->score_row;
                piVar5 = ((ppVar21->field_4).rowcols)->score_col;
                auVar71 = auVar68._0_16_;
                auVar72 = auVar68._16_16_;
                if (uVar58 == uVar29 && uVar60 < uVar63) {
                  iVar65 = vpextrw_avx(auVar72,7);
                  piVar4[uVar60] = iVar65;
                }
                if (s2Len - 1 == uVar60) {
                  iVar65 = vpextrw_avx(auVar72,7);
                  piVar5[uVar58] = iVar65;
                }
                if (uVar60 - 1 < uVar63 && uVar24 == uVar29) {
                  iVar65 = vpextrw_avx(auVar72,6);
                  piVar4[uVar60 - 1] = iVar65;
                }
                if (uVar63 == uVar60 && uVar24 < uVar66) {
                  iVar65 = vpextrw_avx(auVar72,6);
                  piVar5[uVar24] = iVar65;
                }
                if ((uVar33 == uVar29) && ((long)(uVar60 - 2) < (long)uVar63 && 1 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar72,5);
                  piVar4[uVar60 - 2] = iVar65;
                }
                if (uVar63 + 1 == uVar60 && uVar33 < uVar66) {
                  iVar65 = vpextrw_avx(auVar72,5);
                  piVar5[uVar33] = iVar65;
                }
                if ((uVar34 == uVar29) && ((long)(uVar60 - 3) < (long)uVar63 && 2 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar72,4);
                  piVar4[uVar60 - 3] = iVar65;
                }
                if (uVar63 + 2 == uVar60 && uVar34 < uVar66) {
                  iVar65 = vpextrw_avx(auVar72,4);
                  piVar5[uVar34] = iVar65;
                }
                if ((uVar35 == uVar29) && ((long)(uVar60 - 4) < (long)uVar63 && 3 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar72,3);
                  piVar4[uVar60 - 4] = iVar65;
                }
                if (uVar63 + 3 == uVar60 && uVar35 < uVar66) {
                  iVar65 = vpextrw_avx(auVar72,3);
                  piVar5[uVar35] = iVar65;
                }
                if ((uVar36 == uVar29) && ((long)(uVar60 - 5) < (long)uVar63 && 4 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar72,2);
                  piVar4[uVar60 - 5] = iVar65;
                }
                if (uVar63 + 4 == uVar60 && uVar36 < uVar66) {
                  iVar65 = vpextrw_avx(auVar72,2);
                  piVar5[uVar36] = iVar65;
                }
                if ((uVar37 == uVar29) && ((long)(uVar60 - 6) < (long)uVar63 && 5 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar72,1);
                  piVar4[uVar60 - 6] = iVar65;
                }
                if (uVar63 + 5 == uVar60 && uVar37 < uVar66) {
                  iVar65 = vpextrw_avx(auVar72,1);
                  piVar5[uVar37] = iVar65;
                }
                if ((uVar61 == uVar29) && ((long)(uVar60 - 7) < (long)uVar63 && 6 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar72,0);
                  piVar4[uVar60 - 7] = iVar65;
                }
                if (uVar63 + 6 == uVar60 && uVar61 < uVar66) {
                  iVar65 = vpextrw_avx(auVar72,0);
                  piVar5[uVar61] = iVar65;
                }
                if ((uVar38 == uVar29) && ((long)(uVar60 - 8) < (long)uVar63 && 7 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,7);
                  piVar4[uVar60 - 8] = iVar65;
                }
                if (uVar63 + 7 == uVar60 && uVar38 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,7);
                  piVar5[uVar38] = iVar65;
                }
                if ((uVar39 == uVar29) && ((long)(uVar60 - 9) < (long)uVar63 && 8 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,6);
                  piVar4[uVar60 - 9] = iVar65;
                }
                if (uVar63 + 8 == uVar60 && uVar39 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,6);
                  piVar5[uVar39] = iVar65;
                }
                if ((uVar40 == uVar29) && ((long)(uVar60 - 10) < (long)uVar63 && 9 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,5);
                  piVar4[uVar60 - 10] = iVar65;
                }
                if (uVar63 + 9 == uVar60 && uVar40 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,5);
                  piVar5[uVar40] = iVar65;
                }
                if ((uVar41 == uVar29) && ((long)(uVar60 - 0xb) < (long)uVar63 && 10 < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,4);
                  piVar4[uVar60 - 0xb] = iVar65;
                }
                if (uVar63 + 10 == uVar60 && uVar41 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,4);
                  piVar5[uVar41] = iVar65;
                }
                if ((uVar42 == uVar29) && ((long)(uVar60 - 0xc) < (long)uVar63 && 0xb < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,3);
                  piVar4[uVar60 - 0xc] = iVar65;
                }
                if (uVar63 + 0xb == uVar60 && uVar42 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,3);
                  piVar5[uVar42] = iVar65;
                }
                if ((uVar56 == uVar29) && ((long)(uVar60 - 0xd) < (long)uVar63 && 0xc < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,2);
                  piVar4[uVar60 - 0xd] = iVar65;
                }
                if (uVar63 + 0xc == uVar60 && uVar56 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,2);
                  piVar5[uVar56] = iVar65;
                }
                if ((uVar57 == uVar29) && ((long)(uVar60 - 0xe) < (long)uVar63 && 0xd < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,1);
                  piVar4[uVar60 - 0xe] = iVar65;
                }
                if (uVar63 + 0xd == uVar60 && uVar57 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,1);
                  piVar5[uVar57] = iVar65;
                }
                if ((uVar59 == uVar29) && ((long)(uVar60 - 0xf) < (long)uVar63 && 0xe < uVar60)) {
                  iVar65 = vpextrw_avx(auVar71,0);
                  piVar4[uVar60 - 0xf] = iVar65;
                }
                auVar12._2_2_ = iVar67;
                auVar12._0_2_ = iVar67;
                auVar12._4_2_ = iVar67;
                auVar12._6_2_ = iVar67;
                auVar12._8_2_ = iVar67;
                auVar12._10_2_ = iVar67;
                auVar12._12_2_ = iVar67;
                auVar12._14_2_ = iVar67;
                auVar12._16_2_ = iVar67;
                auVar12._18_2_ = iVar67;
                auVar12._20_2_ = iVar67;
                auVar12._22_2_ = iVar67;
                auVar12._24_2_ = iVar67;
                auVar12._26_2_ = iVar67;
                auVar12._28_2_ = iVar67;
                auVar12._30_2_ = iVar67;
                auVar9 = vpblendvb_avx2(auVar9,auVar12,auVar14);
                if (uVar63 + 0xe == uVar60 && uVar59 < uVar66) {
                  iVar65 = vpextrw_avx(auVar71,0);
                  piVar5[uVar59] = iVar65;
                }
                vpextrw_avx(auVar71,0);
                vpextrw_avx(auVar9._0_16_,0);
                auVar17._2_2_ = uStack_be;
                auVar17._0_2_ = local_c0;
                auVar17._4_2_ = uStack_bc;
                auVar17._6_2_ = uStack_ba;
                auVar17._8_2_ = uStack_b8;
                auVar17._10_2_ = uStack_b6;
                auVar17._12_2_ = uStack_b4;
                auVar17._14_2_ = uStack_b2;
                auVar17._16_2_ = uStack_b0;
                auVar17._18_2_ = uStack_ae;
                auVar17._20_2_ = uStack_ac;
                auVar17._22_2_ = uStack_aa;
                auVar17._24_2_ = uStack_a8;
                auVar17._26_2_ = uStack_a6;
                auVar17._28_2_ = uStack_a4;
                auVar17._30_2_ = uStack_a2;
                auVar11 = vpcmpgtw_avx2(auVar17,auVar13);
                auVar11 = vpand_avx2(auVar10,auVar11);
                auVar70 = vpsraw_avx2(auVar13,0xf);
                auVar70 = vpandn_avx2(auVar70,auVar11);
                auVar71 = vpacksswb_avx(auVar70._0_16_,auVar70._16_16_);
                auVar75 = vpcmpeqw_avx2(auVar68,local_160);
                auVar12 = vpcmpgtw_avx2(auVar68,local_160);
                auVar11 = vpand_avx2(auVar12,auVar70);
                auVar72 = vpacksswb_avx(auVar11._0_16_,auVar11._16_16_);
                local_160 = vpblendvb_avx2(local_160,auVar74,auVar11);
                auVar74 = vpcmpgtw_avx2(local_1a0,auVar13);
                auVar74 = vpand_avx2(auVar74,auVar75);
                auVar7 = vpacksswb_avx(auVar74._0_16_,auVar74._16_16_);
                auVar71 = vpblendvb_avx(auVar72,auVar71,auVar7);
                auVar15._2_2_ = iVar67;
                auVar15._0_2_ = iVar67;
                auVar15._4_2_ = iVar67;
                auVar15._6_2_ = iVar67;
                auVar15._8_2_ = iVar67;
                auVar15._10_2_ = iVar67;
                auVar15._12_2_ = iVar67;
                auVar15._14_2_ = iVar67;
                auVar15._16_2_ = iVar67;
                auVar15._18_2_ = iVar67;
                auVar15._20_2_ = iVar67;
                auVar15._22_2_ = iVar67;
                auVar15._24_2_ = iVar67;
                auVar15._26_2_ = iVar67;
                auVar15._28_2_ = iVar67;
                auVar15._30_2_ = iVar67;
                auVar14 = vpblendvb_avx2(auVar73,auVar15,auVar14);
                auVar73 = vpmovsxbw_avx2(auVar71);
                local_220 = vpblendvb_avx2(auVar69._0_32_,local_1c0,auVar73);
                auVar69 = ZEXT3264(local_220);
                auVar74 = vpor_avx2(auVar74,auVar12);
                auVar74 = vpand_avx2(auVar70,auVar74);
                local_1a0 = vpblendvb_avx2(local_1a0,auVar13,auVar74);
                auVar16._8_2_ = 1;
                auVar16._0_8_ = 0x1000100010001;
                auVar16._10_2_ = 1;
                auVar16._12_2_ = 1;
                auVar16._14_2_ = 1;
                auVar16._16_2_ = 1;
                auVar16._18_2_ = 1;
                auVar16._20_2_ = 1;
                auVar16._22_2_ = 1;
                auVar16._24_2_ = 1;
                auVar16._26_2_ = 1;
                auVar16._28_2_ = 1;
                auVar16._30_2_ = 1;
                auVar13 = vpaddsw_avx2(auVar13,auVar16);
                uVar60 = uVar60 + 1;
              } while (uVar23 != uVar60);
              auVar14._8_2_ = 0x10;
              auVar14._0_8_ = 0x10001000100010;
              auVar14._10_2_ = 0x10;
              auVar14._12_2_ = 0x10;
              auVar14._14_2_ = 0x10;
              auVar14._16_2_ = 0x10;
              auVar14._18_2_ = 0x10;
              auVar14._20_2_ = 0x10;
              auVar14._22_2_ = 0x10;
              auVar14._24_2_ = 0x10;
              auVar14._26_2_ = 0x10;
              auVar14._28_2_ = 0x10;
              auVar14._30_2_ = 0x10;
              local_1c0 = vpaddsw_avx2(local_1c0,auVar14);
              uVar58 = uVar58 + 0x10;
            } while (uVar58 < uVar66);
          }
          lVar22 = 0;
          iVar20 = 0;
          iVar65 = 0;
          iVar27 = 0;
          iVar28 = 0;
          do {
            uVar2 = *(ushort *)(local_160 + lVar22 * 2);
            if ((short)(ushort)uVar30 < (short)uVar2) {
              uVar30 = (uint)uVar2;
              iVar65 = (int)*(short *)(local_220 + lVar22 * 2);
              iVar28 = (int)*(short *)(local_1a0 + lVar22 * 2);
              iVar27 = (int)*(short *)(local_1a0 + lVar22 * 2);
              iVar20 = (int)*(short *)(local_220 + lVar22 * 2);
            }
            else if (uVar2 == (ushort)uVar30) {
              iVar44 = (int)*(short *)(local_1a0 + lVar22 * 2);
              if (iVar44 < iVar28) {
                iVar65 = (int)*(short *)(local_220 + lVar22 * 2);
                iVar28 = iVar44;
                iVar27 = iVar44;
                iVar20 = (int)*(short *)(local_220 + lVar22 * 2);
              }
              else if (iVar28 == iVar44) {
                iVar55 = (int)*(short *)(local_220 + lVar22 * 2);
                iVar28 = iVar27;
                if (iVar55 < iVar65) {
                  iVar28 = iVar44;
                }
                bVar6 = iVar55 <= iVar65;
                iVar65 = iVar20;
                iVar27 = iVar28;
                if (bVar6) {
                  iVar65 = iVar55;
                  iVar20 = iVar55;
                }
              }
            }
            sVar43 = (short)uVar30;
            lVar22 = lVar22 + 1;
          } while ((int)lVar22 != 0x10);
          auVar10._2_2_ = iVar67;
          auVar10._0_2_ = iVar67;
          auVar10._4_2_ = iVar67;
          auVar10._6_2_ = iVar67;
          auVar10._8_2_ = iVar67;
          auVar10._10_2_ = iVar67;
          auVar10._12_2_ = iVar67;
          auVar10._14_2_ = iVar67;
          auVar10._16_2_ = iVar67;
          auVar10._18_2_ = iVar67;
          auVar10._20_2_ = iVar67;
          auVar10._22_2_ = iVar67;
          auVar10._24_2_ = iVar67;
          auVar10._26_2_ = iVar67;
          auVar10._28_2_ = iVar67;
          auVar10._30_2_ = iVar67;
          auVar13 = vpcmpgtw_avx2(auVar10,local_200);
          auVar8._2_2_ = sStack_17e;
          auVar8._0_2_ = local_180;
          auVar8._4_2_ = sStack_17c;
          auVar8._6_2_ = sStack_17a;
          auVar8._8_2_ = sStack_178;
          auVar8._10_2_ = sStack_176;
          auVar8._12_2_ = sStack_174;
          auVar8._14_2_ = sStack_172;
          auVar8._16_2_ = sStack_170;
          auVar8._18_2_ = sStack_16e;
          auVar8._20_2_ = sStack_16c;
          auVar8._22_2_ = sStack_16a;
          auVar8._24_2_ = sStack_168;
          auVar8._26_2_ = sStack_166;
          auVar8._28_2_ = sStack_164;
          auVar8._30_2_ = sStack_162;
          auVar68 = vpcmpgtw_avx2(local_1e0,auVar8);
          auVar13 = vpor_avx2(auVar13,auVar68);
          if ((((((((((((((((((((((((((((((((auVar13 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar13 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar13 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar13 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar13 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar13 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar13 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar13 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar13 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar13 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar13 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar13 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar13 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar13 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar13 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar13 >> 0x7f,0) != '\0') ||
                            (auVar13 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar13 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar13 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar13 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar13 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar13 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0xbf,0) != '\0') ||
                    (auVar13 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar13 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar13 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar13 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
            sVar43 = 0;
            iVar28 = 0;
            iVar65 = 0;
          }
          ppVar21->score = (int)sVar43;
          ppVar21->end_query = iVar65;
          ppVar21->end_ref = iVar28;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_02);
            return ppVar21;
          }
          return ppVar21;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}